

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O3

EntryPtr __thiscall
cursespp::SimpleScrollAdapter::GetEntry
          (SimpleScrollAdapter *this,ScrollableWindow *window,size_t index)

{
  WINDOW **ppWVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  SingleLineEntry *this_00;
  reference pvVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  size_type in_RCX;
  _Base_ptr p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  iterator __position;
  PANEL **this_01;
  undefined1 auVar8 [16];
  EntryPtr EVar9;
  ulong local_50;
  mapped_type local_48;
  Color local_40;
  Color local_38;
  
  local_50 = in_RCX;
  pvVar3 = std::
           deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
           ::at((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                 *)&(window->super_Window).contentColor,in_RCX);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)
       (pvVar3->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var2 = (pvVar3->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->super_ScrollAdapterBase).width = (size_t)p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  _Var7._M_pi = extraout_RDX;
  if ((index != 0) && ((window->super_Window).lastNotifiedVisible == true)) {
    p_Var6 = (_Base_ptr)(window->super_Window).contentPanel;
    ppWVar1 = &(window->super_Window).frame;
    p_Var4 = (_Base_ptr)ppWVar1;
    __position._M_node = (_Base_ptr)ppWVar1;
    if (p_Var6 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var6 + 1) >= local_50) {
          p_Var4 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < local_50];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((p_Var4 != (_Base_ptr)ppWVar1) &&
         (__position._M_node = p_Var4, local_50 < *(ulong *)(p_Var4 + 1))) {
        __position._M_node = (_Base_ptr)ppWVar1;
      }
    }
    this_00 = (SingleLineEntry *)
              (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter;
    auVar8 = (**(code **)(*(long *)index + 0x208))(index);
    _Var7._M_pi = auVar8._8_8_;
    this_01 = &(window->super_Window).framePanel;
    if (local_50 == *(ulong *)(auVar8._0_8_ + 0x20)) {
      if (__position._M_node == (_Base_ptr)ppWVar1) {
        (*(this_00->super_IEntry)._vptr_IEntry[5])(&local_48,this_00,0);
        pmVar5 = std::
                 map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                 ::operator[]((map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                               *)this_01,&local_50);
        pmVar5->value = local_48.value;
      }
      local_38.value = 0x200;
      SingleLineEntry::SetAttrs(this_00,&local_38);
      _Var7._M_pi = extraout_RDX_00;
    }
    else if (__position._M_node != (_Base_ptr)ppWVar1) {
      local_40.value = (int64_t)__position._M_node[1]._M_parent;
      SingleLineEntry::SetAttrs(this_00,&local_40);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
                          *)this_01,__position);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var7._M_pi;
  EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (EntryPtr)
         EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

EntryPtr SimpleScrollAdapter::GetEntry(cursespp::ScrollableWindow* window, size_t index) {
    auto entry = this->entries.at(index);

    /* this is pretty damned gross, but super convenient; we always use SingleLineEntry
    internally, so we can do a static_cast<>. we allow the user to customize the
    color of the line when it's de-selected, so when it becomes selected we remember
    the original color. upon de-select, the color is restored (see indexToColor) */
    if (window && selectable) {
        SingleLineEntry* single = static_cast<SingleLineEntry*>(entry.get());
        auto it = indexToColor.find(index);
        if (index == window->GetScrollPosition().logicalIndex) {
            if (it == indexToColor.end()) {
                indexToColor[index] = single->GetAttrs(0);
            }
            single->SetAttrs(Color(Color::ListItemHighlighted));
        }
        else {
            if (it != indexToColor.end()) {
                single->SetAttrs(it->second);
                indexToColor.erase(it);
            }
        }
    }

    return entry;
}